

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_normal_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialNormalAttributeDecoder::DecodeDataNeededByPortableTransform
          (SequentialNormalAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  bool bVar1;
  uint16_t uVar2;
  PointCloudDecoder *this_00;
  PointAttribute *in_RDX;
  AttributeOctahedronTransform *in_RSI;
  DecoderBuffer *in_RDI;
  PointAttribute *in_stack_00000008;
  AttributeTransform *in_stack_00000010;
  DecoderBuffer *this_01;
  
  this_01 = in_RDI;
  this_00 = SequentialAttributeDecoder::decoder((SequentialAttributeDecoder *)in_RDI);
  uVar2 = PointCloudDecoder::bitstream_version(this_00);
  if (0x1ff < uVar2) {
    SequentialAttributeDecoder::GetPortableAttribute((SequentialAttributeDecoder *)this_01);
    bVar1 = AttributeOctahedronTransform::DecodeParameters(in_RSI,in_RDX,in_RDI);
    if (!bVar1) {
      return false;
    }
  }
  SequentialAttributeDecoder::portable_attribute((SequentialAttributeDecoder *)0x1f1e0e);
  bVar1 = AttributeTransform::TransferToAttribute(in_stack_00000010,in_stack_00000008);
  return bVar1;
}

Assistant:

bool SequentialNormalAttributeDecoder::DecodeDataNeededByPortableTransform(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  if (decoder()->bitstream_version() >= DRACO_BITSTREAM_VERSION(2, 0)) {
    // For newer file version, decode attribute transform data here.
    if (!octahedral_transform_.DecodeParameters(*GetPortableAttribute(),
                                                in_buffer)) {
      return false;
    }
  }

  // Store the decoded transform data in portable attribute.
  return octahedral_transform_.TransferToAttribute(portable_attribute());
}